

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hpp
# Opt level: O0

void jsonip::grammar::string_rule::
     process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>,std::pair<char_const*,long>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state,
               pair<const_char_*,_long> *mp)

{
  semantic_state *this;
  undefined1 local_38 [8];
  string s;
  pair<const_char_*,_long> *mp_local;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  s.field_2._8_8_ = mp;
  parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::to_string_abi_cxx11_
            ((string *)local_38,state,mp->first + 1,mp->second - 2);
  parser::decode_string((string *)local_38);
  this = parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::semantic_state(state);
  semantic_state::new_string(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static inline void process_match (S& state, match_pair const& mp)
        {
            std::string s = state.to_string(mp.first + typename S::OffsetType(1), mp.second - 2);
            decode_string(s);
            state.semantic_state().new_string(s);
        }